

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O2

void ggml_compute_forward_hardsigmoid(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  ggml_type gVar2;
  ggml_tensor *src0;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  FILE *__stream;
  char cVar13;
  ggml_bf16_t gVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int64_t ir;
  long lVar20;
  char *pcVar21;
  long lVar22;
  long lVar23;
  int64_t ir_2;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  pair<long,_long> pVar29;
  undefined8 uStack_90;
  
  __stream = _stderr;
  src0 = dst->src[0];
  gVar1 = dst->type;
  gVar2 = src0->type;
  if (gVar2 == GGML_TYPE_BF16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 4) {
LAB_0012b7d6:
          pcVar21 = "nb0 == sizeof(dst_t)";
          uStack_90 = 0x55;
          goto LAB_0012b806;
        }
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[1];
          sVar4 = src0->nb[2];
          lVar5 = src0->ne[1];
          lVar23 = src0->ne[2];
          sVar6 = dst->nb[1];
          sVar8 = dst->nb[3];
          sVar9 = src0->nb[3];
          uVar7 = dst->ne[0];
          sVar10 = dst->nb[2];
          pVar29 = get_thread_range(params,src0);
          lVar23 = lVar23 * lVar5;
          for (lVar20 = pVar29.first; lVar20 < pVar29.second; lVar20 = lVar20 + 1) {
            lVar15 = lVar20 / lVar23;
            lVar22 = lVar20 % lVar23;
            lVar16 = lVar22 / lVar5;
            lVar22 = lVar22 % lVar5;
            pvVar11 = dst->data;
            pvVar12 = src0->data;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              auVar27._0_4_ =
                   ((float)((uint)*(ushort *)
                                   ((long)pvVar12 +
                                   uVar17 * 2 + lVar22 * sVar3 + lVar15 * sVar9 + lVar16 * sVar4) <<
                           0x10) + 3.0) / 6.0;
              auVar27._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar27 = vmaxss_avx(auVar27,ZEXT816(0) << 0x40);
              auVar27 = vminss_avx(auVar27,SUB6416(ZEXT464(0x3f800000),0));
              *(int *)((long)pvVar11 +
                      uVar17 * 4 + lVar22 * sVar6 + lVar15 * sVar8 + lVar16 * sVar10) =
                   auVar27._0_4_;
            }
          }
          return;
        }
LAB_0012b7ef:
        pcVar21 = "nb00 == sizeof(src0_t)";
        uStack_90 = 0x56;
        goto LAB_0012b806;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_BF16) goto LAB_0012b785;
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012b7d6;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[1];
          sVar4 = src0->nb[2];
          sVar6 = src0->nb[3];
          lVar5 = src0->ne[1];
          lVar23 = src0->ne[2];
          uVar7 = dst->ne[0];
          sVar8 = dst->nb[1];
          sVar9 = dst->nb[2];
          sVar10 = dst->nb[3];
          pVar29 = get_thread_range(params,src0);
          lVar23 = lVar23 * lVar5;
          for (lVar20 = pVar29.first; lVar20 < pVar29.second; lVar20 = lVar20 + 1) {
            lVar15 = lVar20 / lVar23;
            lVar22 = lVar20 % lVar23;
            lVar16 = lVar22 / lVar5;
            lVar22 = lVar22 % lVar5;
            pvVar11 = src0->data;
            pvVar12 = dst->data;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              auVar24._0_4_ =
                   ((float)((uint)*(ushort *)
                                   ((long)pvVar11 +
                                   uVar17 * 2 + lVar22 * sVar3 + lVar15 * sVar6 + lVar16 * sVar4) <<
                           0x10) + 3.0) / 6.0;
              auVar24._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar27 = vmaxss_avx(auVar24,ZEXT416(0));
              auVar27 = vminss_avx(auVar27,ZEXT416(0x3f800000));
              gVar14 = f32_to_bf16(auVar27._0_4_);
              *(uint16_t *)
               ((long)pvVar12 + uVar17 * 2 + lVar22 * sVar8 + lVar15 * sVar10 + lVar16 * sVar9) =
                   gVar14.bits;
            }
          }
          return;
        }
        goto LAB_0012b7ef;
      }
    }
  }
  else if (gVar2 == GGML_TYPE_F16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_0012b7d6;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[2];
          sVar4 = src0->nb[3];
          sVar6 = src0->nb[1];
          lVar5 = src0->ne[1];
          lVar23 = src0->ne[2];
          sVar8 = dst->nb[2];
          sVar9 = dst->nb[3];
          uVar7 = dst->ne[0];
          sVar10 = dst->nb[1];
          pVar29 = get_thread_range(params,src0);
          lVar23 = lVar23 * lVar5;
          for (lVar20 = pVar29.first; lVar20 < pVar29.second; lVar20 = lVar20 + 1) {
            lVar15 = lVar20 / lVar23;
            lVar22 = lVar20 % lVar23;
            lVar16 = lVar22 / lVar5;
            lVar22 = lVar22 % lVar5;
            pvVar11 = dst->data;
            pvVar12 = src0->data;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              auVar28._0_4_ =
                   (*(float *)(&ggml_table_f32_f16 +
                              (ulong)*(ushort *)
                                      ((long)pvVar12 +
                                      uVar17 * 2 + lVar22 * sVar6 + lVar15 * sVar4 + lVar16 * sVar3)
                              * 4) + 3.0) / 6.0;
              auVar28._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar27 = vmaxss_avx(auVar28,ZEXT816(0) << 0x40);
              auVar27 = vminss_avx(auVar27,SUB6416(ZEXT464(0x3f800000),0));
              *(int *)((long)pvVar11 +
                      uVar17 * 4 + lVar22 * sVar10 + lVar15 * sVar9 + lVar16 * sVar8) =
                   auVar27._0_4_;
            }
          }
          return;
        }
        goto LAB_0012b7ef;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_F16) goto LAB_0012b785;
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012b7d6;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[2];
          sVar4 = src0->nb[3];
          sVar6 = src0->nb[1];
          lVar5 = src0->ne[1];
          lVar23 = src0->ne[2];
          uVar7 = dst->ne[0];
          pVar29 = get_thread_range(params,src0);
          lVar23 = lVar23 * lVar5;
          for (lVar20 = pVar29.first; lVar20 < pVar29.second; lVar20 = lVar20 + 1) {
            lVar15 = lVar20 % lVar23;
            for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
              auVar26._0_4_ =
                   (*(float *)(&ggml_table_f32_f16 +
                              (ulong)*(ushort *)
                                      ((long)src0->data +
                                      uVar17 * 2 +
                                      (lVar15 % lVar5) * sVar6 + (lVar20 / lVar23) * sVar4 +
                                      (lVar15 / lVar5) * sVar3) * 4) + 3.0) / 6.0;
              auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar27 = vmaxss_avx(auVar26,ZEXT816(0) << 0x40);
              auVar27 = vminss_avx(auVar27,SUB6416(ZEXT464(0x3f800000),0));
              auVar27 = vcvtps2ph_f16c(auVar27,0);
              vpextrw_avx(auVar27,0);
            }
          }
          return;
        }
        goto LAB_0012b7ef;
      }
    }
  }
  else {
    if ((gVar2 != GGML_TYPE_F32) || (gVar1 != GGML_TYPE_F32)) {
LAB_0012b785:
      uVar18 = ggml_type_name();
      uVar19 = ggml_type_name(src0->type);
      fprintf(__stream,"%s: unsupported types: dst: %s, src0: %s\n","unary_op",uVar18,uVar19);
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
                 ,0x78,"fatal error");
    }
    cVar13 = ggml_is_contiguous_1(src0);
    if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
       (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012b7d6;
      if (src0->nb[0] == 4) {
        sVar3 = src0->nb[1];
        sVar4 = src0->nb[2];
        lVar5 = src0->ne[1];
        lVar23 = src0->ne[2];
        sVar6 = src0->nb[3];
        uVar7 = dst->ne[0];
        sVar8 = dst->nb[1];
        sVar9 = dst->nb[2];
        sVar10 = dst->nb[3];
        pVar29 = get_thread_range(params,src0);
        lVar23 = lVar23 * lVar5;
        for (lVar20 = pVar29.first; lVar20 < pVar29.second; lVar20 = lVar20 + 1) {
          lVar15 = lVar20 / lVar23;
          lVar22 = lVar20 % lVar23;
          lVar16 = lVar22 / lVar5;
          lVar22 = lVar22 % lVar5;
          pvVar11 = dst->data;
          pvVar12 = src0->data;
          for (uVar17 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar17; uVar17 = uVar17 + 1) {
            auVar25._0_4_ =
                 (*(float *)((long)pvVar12 +
                            uVar17 * 4 + lVar22 * sVar3 + lVar15 * sVar6 + lVar16 * sVar4) + 3.0) /
                 6.0;
            auVar25._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar27 = vmaxss_avx(auVar25,ZEXT816(0) << 0x40);
            auVar27 = vminss_avx(auVar27,SUB6416(ZEXT464(0x3f800000),0));
            *(int *)((long)pvVar11 + uVar17 * 4 + lVar22 * sVar8 + lVar15 * sVar10 + lVar16 * sVar9)
                 = auVar27._0_4_;
          }
        }
        return;
      }
      goto LAB_0012b7ef;
    }
  }
  pcVar21 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uStack_90 = 0x51;
LAB_0012b806:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/unary-ops.cpp"
             ,uStack_90,"GGML_ASSERT(%s) failed",pcVar21);
}

Assistant:

void ggml_compute_forward_hardsigmoid(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_hardsigmoid>(params, dst);
}